

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O0

void * __thiscall
SectionHdrWrapper::getFieldPtr(SectionHdrWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IMAGE_SECTION_HEADER *sec;
  size_t subField_local;
  size_t fieldId_local;
  SectionHdrWrapper *this_local;
  
  iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  this_local = (SectionHdrWrapper *)CONCAT44(extraout_var,iVar1);
  if (this_local == (SectionHdrWrapper *)0x0) {
    this_local = (SectionHdrWrapper *)0x0;
  }
  else if (this->name == (char *)0x0) {
    this_local = (SectionHdrWrapper *)0x0;
  }
  else {
    switch(fieldId) {
    case 0:
      break;
    case 1:
      this_local = (SectionHdrWrapper *)
                   &(this_local->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                    m_Exe;
      break;
    case 2:
      this_local = (SectionHdrWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.
                           super_ExeElementWrapper.m_Exe + 4);
      break;
    case 3:
      this_local = (SectionHdrWrapper *)
                   &(this_local->super_PENodeWrapper).super_ExeNodeWrapper.parentNode;
      break;
    case 4:
      this_local = (SectionHdrWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.parentNode + 4);
      break;
    case 5:
      this_local = (SectionHdrWrapper *)
                   &(this_local->super_PENodeWrapper).super_ExeNodeWrapper.entryNum;
      break;
    case 6:
      this_local = (SectionHdrWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.entryNum + 4);
      break;
    case 7:
      this_local = (SectionHdrWrapper *)
                   &(this_local->super_PENodeWrapper).super_ExeNodeWrapper.entries;
      break;
    case 8:
      this_local = (SectionHdrWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.entries.
                           super__Vector_base<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + 2);
      break;
    case 9:
      this_local = (SectionHdrWrapper *)
                   ((long)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.entries.
                           super__Vector_base<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + 4);
      break;
    default:
      iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
      this_local = (SectionHdrWrapper *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  return this_local;
}

Assistant:

void* SectionHdrWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    IMAGE_SECTION_HEADER* sec = (IMAGE_SECTION_HEADER*) getPtr();
    if (!sec) return NULL;
    if (!this->name) return NULL;
    switch (fieldId)
    {
        case NAME: return (void*) &sec->Name;
        case VSIZE: return (void*) &sec->Misc.VirtualSize;
        case VPTR: return (void*) &sec->VirtualAddress;
        case RSIZE: return (void*) &sec->SizeOfRawData;
        case RPTR: return(void*) &sec->PointerToRawData;

        case RELOC_PTR: return (void*) &sec->PointerToRelocations;
        case RELOC_NUM: return (void*) &sec->NumberOfRelocations;
        case LINENUM_PTR: return (void*) &sec->PointerToLinenumbers;
        case LINENUM_NUM: return (void*) &sec->NumberOfLinenumbers;

        case CHARACT: return (void*) &sec->Characteristics;
    }
    return this->getPtr();
}